

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O3

void Imf_2_5::RgbaYca::decimateChromaHoriz(int n,Rgba *ycaIn,Rgba *ycaOut)

{
  unsigned_short uVar1;
  ulong uVar2;
  int iVar3;
  float fVar4;
  
  if (0 < n) {
    iVar3 = 0xd;
    if (0xd < n + 0xc) {
      iVar3 = n + 0xc;
    }
    uVar2 = 0;
    do {
      if ((uVar2 & 1) == 0) {
        fVar4 = half::_toFloat[ycaIn[uVar2 + 0x1a].r._h].f * 0.001064 +
                half::_toFloat[ycaIn[uVar2 + 0x18].r._h].f * -0.003771 +
                half::_toFloat[ycaIn[uVar2 + 0x16].r._h].f * 0.009801 +
                half::_toFloat[ycaIn[uVar2 + 0x14].r._h].f * -0.021586 +
                half::_toFloat[ycaIn[uVar2 + 0x12].r._h].f * 0.043978 +
                half::_toFloat[ycaIn[uVar2 + 0x10].r._h].f * -0.093067 +
                half::_toFloat[ycaIn[uVar2 + 0xe].r._h].f * 0.313659 +
                half::_toFloat[ycaIn[uVar2 + 0xd].r._h].f * 0.499846 +
                half::_toFloat[ycaIn[uVar2 + 0xc].r._h].f * 0.313659 +
                half::_toFloat[ycaIn[uVar2 + 10].r._h].f * -0.093067 +
                half::_toFloat[ycaIn[uVar2 + 8].r._h].f * 0.043978 +
                half::_toFloat[ycaIn[uVar2 + 6].r._h].f * -0.021586 +
                half::_toFloat[ycaIn[uVar2 + 4].r._h].f * 0.009801 +
                half::_toFloat[ycaIn[uVar2].r._h].f * 0.001064 +
                half::_toFloat[ycaIn[uVar2 + 2].r._h].f * -0.003771;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          if (half::_eLut[(uint)fVar4 >> 0x17] == 0) {
            uVar1 = half::convert((int)fVar4);
          }
          else {
            uVar1 = half::_eLut[(uint)fVar4 >> 0x17] +
                    (short)(((uint)fVar4 & 0x7fffff) + 0xfff + (uint)(((uint)fVar4 >> 0xd & 1) != 0)
                           >> 0xd);
          }
        }
        else {
          uVar1 = (unsigned_short)((uint)fVar4 >> 0x10);
        }
        ycaOut[uVar2].r._h = uVar1;
        fVar4 = half::_toFloat[ycaIn[uVar2 + 0x1a].b._h].f * 0.001064 +
                half::_toFloat[ycaIn[uVar2 + 0x18].b._h].f * -0.003771 +
                half::_toFloat[ycaIn[uVar2 + 0x16].b._h].f * 0.009801 +
                half::_toFloat[ycaIn[uVar2 + 0x14].b._h].f * -0.021586 +
                half::_toFloat[ycaIn[uVar2 + 0x12].b._h].f * 0.043978 +
                half::_toFloat[ycaIn[uVar2 + 0x10].b._h].f * -0.093067 +
                half::_toFloat[ycaIn[uVar2 + 0xe].b._h].f * 0.313659 +
                half::_toFloat[ycaIn[uVar2 + 0xd].b._h].f * 0.499846 +
                half::_toFloat[ycaIn[uVar2 + 0xc].b._h].f * 0.313659 +
                half::_toFloat[ycaIn[uVar2 + 10].b._h].f * -0.093067 +
                half::_toFloat[ycaIn[uVar2 + 8].b._h].f * 0.043978 +
                half::_toFloat[ycaIn[uVar2 + 6].b._h].f * -0.021586 +
                half::_toFloat[ycaIn[uVar2 + 4].b._h].f * 0.009801 +
                half::_toFloat[ycaIn[uVar2].b._h].f * 0.001064 +
                half::_toFloat[ycaIn[uVar2 + 2].b._h].f * -0.003771;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          if (half::_eLut[(uint)fVar4 >> 0x17] == 0) {
            uVar1 = half::convert((int)fVar4);
          }
          else {
            uVar1 = half::_eLut[(uint)fVar4 >> 0x17] +
                    (short)(((uint)fVar4 & 0x7fffff) + 0xfff + (uint)(((uint)fVar4 >> 0xd & 1) != 0)
                           >> 0xd);
          }
        }
        else {
          uVar1 = (unsigned_short)((uint)fVar4 >> 0x10);
        }
        ycaOut[uVar2].b._h = uVar1;
      }
      ycaOut[uVar2].g._h = ycaIn[uVar2 + 0xd].g._h;
      ycaOut[uVar2].a._h = ycaIn[uVar2 + 0xd].a._h;
      uVar2 = uVar2 + 1;
    } while (iVar3 - 0xc != uVar2);
  }
  return;
}

Assistant:

void
decimateChromaHoriz (int n,
		     const Rgba ycaIn[/*n+N-1*/],
		     Rgba ycaOut[/*n*/])
{
    #ifdef DEBUG
	assert (ycaIn != ycaOut);
    #endif

    int begin = N2;
    int end = begin + n;

    for (int i = begin, j = 0; i < end; ++i, ++j)
    {
	if ((j & 1) == 0)
	{
	    ycaOut[j].r = ycaIn[i - 13].r *  0.001064f +
			  ycaIn[i - 11].r * -0.003771f +
			  ycaIn[i -  9].r *  0.009801f +
			  ycaIn[i -  7].r * -0.021586f +
			  ycaIn[i -  5].r *  0.043978f +
			  ycaIn[i -  3].r * -0.093067f +
			  ycaIn[i -  1].r *  0.313659f +
			  ycaIn[i     ].r *  0.499846f +
			  ycaIn[i +  1].r *  0.313659f +
			  ycaIn[i +  3].r * -0.093067f +
			  ycaIn[i +  5].r *  0.043978f +
			  ycaIn[i +  7].r * -0.021586f +
			  ycaIn[i +  9].r *  0.009801f +
			  ycaIn[i + 11].r * -0.003771f +
			  ycaIn[i + 13].r *  0.001064f;

	    ycaOut[j].b = ycaIn[i - 13].b *  0.001064f +
			  ycaIn[i - 11].b * -0.003771f +
			  ycaIn[i -  9].b *  0.009801f +
			  ycaIn[i -  7].b * -0.021586f +
			  ycaIn[i -  5].b *  0.043978f +
			  ycaIn[i -  3].b * -0.093067f +
			  ycaIn[i -  1].b *  0.313659f +
			  ycaIn[i     ].b *  0.499846f +
			  ycaIn[i +  1].b *  0.313659f +
			  ycaIn[i +  3].b * -0.093067f +
			  ycaIn[i +  5].b *  0.043978f +
			  ycaIn[i +  7].b * -0.021586f +
			  ycaIn[i +  9].b *  0.009801f +
			  ycaIn[i + 11].b * -0.003771f +
			  ycaIn[i + 13].b *  0.001064f;
	}

	ycaOut[j].g = ycaIn[i].g;
	ycaOut[j].a = ycaIn[i].a;
    }
}